

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

int __thiscall Jupiter::HTTP::Server::think(Server *this)

{
  pointer puVar1;
  _Head_base<0UL,_HTTPSession_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  long lVar6;
  size_type sVar7;
  rep rVar8;
  iterator iVar9;
  Data *pDVar10;
  undefined4 extraout_var;
  HTTPSession *pHVar11;
  size_type sVar12;
  HTTPSession *in_RCX;
  char *pcVar13;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  pointer *__ptr;
  pointer __old_p;
  Socket *pSVar14;
  char *in_RSI;
  iterator __position;
  vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
  *this_01;
  size_t in_R8;
  size_t sVar15;
  pointer puVar16;
  string_view sVar17;
  string_view sock_buffer;
  _Head_base<0UL,_HTTPSession_*,_false> local_48;
  string_view local_40;
  Socket *this_00;
  
  pDVar10 = this->m_data;
  __position._M_current =
       (pDVar10->m_sessions).
       super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (pDVar10->m_sessions).
      super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar3 = Socket::isShutdown(&(((__position._M_current)->_M_t).
                                   super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                   .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->sock)
      ;
      if (bVar3) {
        sVar5 = Socket::recv(&(((__position._M_current)->_M_t).
                               super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                               .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->sock,
                             (int)in_RSI,__buf,(size_t)in_RCX,(int)in_R8);
        if ((int)sVar5 != 0) goto LAB_0012ae6e;
LAB_0012af4d:
        pDVar10 = this->m_data;
LAB_0012af51:
        this_01 = &pDVar10->m_sessions;
LAB_0012af55:
        iVar9 = std::
                vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
                ::_M_erase(this_01,__position);
      }
      else {
        lVar6 = std::chrono::_V2::steady_clock::now();
        pDVar10 = this->m_data;
        in_RCX = ((__position._M_current)->_M_t).
                 super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                 super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                 super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
        __buf_00 = (void *)((pDVar10->keep_alive_session_timeout).__r * 1000000 +
                           (in_RCX->last_active).__d.__r);
        if ((long)__buf_00 < lVar6) goto LAB_0012af51;
        if (in_RCX->keep_alive == false) {
          lVar6 = std::chrono::_V2::steady_clock::now();
          pDVar10 = this->m_data;
          in_RCX = ((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                   super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                   super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
          __buf_00 = (void *)((pDVar10->session_timeout).__r * 1000000 +
                             (in_RCX->last_active).__d.__r);
          if ((long)__buf_00 < lVar6) goto LAB_0012af51;
        }
        sVar5 = Socket::recv(&in_RCX->sock,(int)in_RSI,__buf_00,(size_t)in_RCX,(int)in_R8);
        if (0 < (int)sVar5) {
          sVar17 = Socket::getBuffer(&(((__position._M_current)->_M_t).
                                       super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                                       .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->
                                      sock);
          pHVar11 = ((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                    super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                    super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
          if ((pHVar11->request)._M_string_length + sVar17._M_len <= this->m_data->max_request_size)
          {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&pHVar11->request,sVar17._M_str,sVar17._M_len);
            in_RCX = (HTTPSession *)0x4;
            in_RSI = "\r\n\r\n";
            sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find(&(((__position._M_current)->_M_t).
                             super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                             .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->request,
                           "\r\n\r\n",0,4);
            if (sVar7 == 0xffffffffffffffff) {
              pDVar10 = this->m_data;
              if (((((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                    super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                    super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->request).
                  _M_string_length == pDVar10->max_request_size) goto LAB_0012af51;
            }
            else {
              rVar8 = std::chrono::_V2::steady_clock::now();
              in_RSI = (char *)((__position._M_current)->_M_t).
                               super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>
                               .super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl;
              (((HTTPSession *)in_RSI)->last_active).__d.__r = rVar8;
              Data::process_request(this->m_data,(HTTPSession *)in_RSI);
              if ((((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<HTTPSession,_std::default_delete<HTTPSession>_>._M_t.
                   super__Tuple_impl<0UL,_HTTPSession_*,_std::default_delete<HTTPSession>_>.
                   super__Head_base<0UL,_HTTPSession_*,_false>._M_head_impl)->keep_alive == false)
              goto LAB_0012af4d;
            }
            goto LAB_0012ae6e;
          }
          in_RCX = (HTTPSession *)&this->m_data->m_sessions;
          this_01 = (vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
                     *)in_RCX;
          goto LAB_0012af55;
        }
        iVar4 = Socket::getLastError();
        if (iVar4 != 0xb) goto LAB_0012af4d;
LAB_0012ae6e:
        iVar9._M_current = __position._M_current + 1;
        __position._M_current = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)in_RSI
        ;
      }
      pDVar10 = this->m_data;
      in_RSI = (char *)__position._M_current;
      __position._M_current = iVar9._M_current;
    } while (iVar9._M_current !=
             (pDVar10->m_sessions).
             super__Vector_base<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  sVar17._M_str = (char *)in_RCX;
  sVar17._M_len = in_R8;
  puVar16 = (pDVar10->m_ports).
            super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pDVar10->m_ports).
           super__Vector_base<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 != puVar1) {
    pSVar14 = (Socket *)0x0;
    do {
      iVar4 = (*((puVar16->_M_t).
                 super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
                 super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
                 super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl)->_vptr_Socket[3])();
      this_00 = (Socket *)CONCAT44(extraout_var,iVar4);
      if (pSVar14 != (Socket *)0x0) {
        (*pSVar14->_vptr_Socket[0xe])(pSVar14);
      }
      if (this_00 != (Socket *)0x0) {
        Socket::setBlocking(this_00,false);
        pHVar11 = (HTTPSession *)operator_new(0x50);
        pSVar14 = this_00;
        HTTPSession::HTTPSession(pHVar11,this_00);
        local_48._M_head_impl = pHVar11;
        sVar5 = Socket::recv((Socket *)pHVar11,(int)pSVar14,__buf_01,(size_t)sVar17._M_str,
                             (int)sVar17._M_len);
        sVar15 = sVar17._M_len;
        if ((int)sVar5 < 1) {
          iVar4 = Socket::getLastError();
          if (iVar4 == 0xb) {
            std::
            vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
            ::emplace_back<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>
                      ((vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
                        *)&this->m_data->m_sessions,
                       (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)&local_48);
          }
        }
        else {
          local_40 = Socket::getBuffer(&(local_48._M_head_impl)->sock);
          pcVar13 = (char *)this->m_data->max_request_size;
          sVar17._M_str = pcVar13;
          sVar17._M_len = sVar15;
          if ((char *)local_40._M_len < pcVar13) {
            sVar17 = Socket::getBuffer(&(local_48._M_head_impl)->sock);
            sVar7 = sVar17._M_len;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&(local_48._M_head_impl)->request,0,
                       ((local_48._M_head_impl)->request)._M_string_length,sVar17._M_str,sVar7);
            pcVar13 = (char *)0x4;
            sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find
                               (&local_40,"\r\n\r\n",0,4);
            sVar17._M_str = pcVar13;
            sVar17._M_len = sVar7;
            pDVar10 = this->m_data;
            if (sVar12 != 0xffffffffffffffff) {
              Data::process_request(pDVar10,local_48._M_head_impl);
              sVar17._M_str = pcVar13;
              sVar17._M_len = sVar7;
LAB_0012b0d3:
              if ((local_48._M_head_impl)->keep_alive != true) goto LAB_0012b0ed;
              pDVar10 = this->m_data;
            }
            std::
            vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
            ::emplace_back<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>
                      ((vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>
                        *)&pDVar10->m_sessions,
                       (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)&local_48);
          }
          else if ((char *)local_40._M_len == pcVar13) {
            pcVar13 = (char *)0x4;
            sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find
                               (&local_40,"\r\n\r\n",0,4);
            sVar17._M_str = pcVar13;
            sVar17._M_len = sVar15;
            if (sVar12 != 0xffffffffffffffff) {
              sVar17 = Socket::getBuffer(&(local_48._M_head_impl)->sock);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(&(local_48._M_head_impl)->request,0,
                         ((local_48._M_head_impl)->request)._M_string_length,sVar17._M_str,
                         sVar17._M_len);
              Data::process_request(this->m_data,local_48._M_head_impl);
              goto LAB_0012b0d3;
            }
          }
        }
LAB_0012b0ed:
        _Var2._M_head_impl = local_48._M_head_impl;
        if (local_48._M_head_impl != (HTTPSession *)0x0) {
          HTTPSession::~HTTPSession(local_48._M_head_impl);
          operator_delete(_Var2._M_head_impl,0x50);
        }
      }
      puVar16 = puVar16 + 1;
      pSVar14 = this_00;
    } while (puVar16 != puVar1);
    if (this_00 != (Socket *)0x0) {
      (*this_00->_vptr_Socket[0xe])(this_00);
    }
  }
  return 0;
}

Assistant:

int Jupiter::HTTP::Server::think() {
	// Process existing clients
	for (auto itr = m_data->m_sessions.begin(); itr != m_data->m_sessions.end();) {
		auto& session = *itr;
		if (session->sock.isShutdown()) {
			if (session->sock.recv() == 0) {
				itr = m_data->m_sessions.erase(itr);
				continue;
			}
		}
		else if ((std::chrono::steady_clock::now() > session->last_active + m_data->keep_alive_session_timeout)
			|| (session->keep_alive == false && std::chrono::steady_clock::now() > session->last_active + m_data->session_timeout)) {
			itr = m_data->m_sessions.erase(itr);
			continue;
		}
		else if (session->sock.recv() > 0) {
			std::string_view sock_buffer = session->sock.getBuffer();
			if (session->request.size() + sock_buffer.size() <= m_data->max_request_size) { // accept
				session->request += sock_buffer;
				if (session->request.find(HTTP_REQUEST_ENDING) != std::string::npos) { // completed request
					session->last_active = std::chrono::steady_clock::now();
					m_data->process_request(*session);
					if (session->keep_alive == false) { // remove completed session
						itr = m_data->m_sessions.erase(itr);
						//session->sock.shutdown();
						continue;
					}
					// else // keep_alive: session not deleted
				}
				else if (session->request.size() == m_data->max_request_size) { // reject (full buffer)
					itr = m_data->m_sessions.erase(itr);
					continue;
				}
				// else // request not over: session not deleted
			}
			else { // reject
				itr = m_data->m_sessions.erase(itr);
				continue;
			}
		}
		else if (session->sock.getLastError() != JUPITER_SOCK_EWOULDBLOCK) {
			itr = m_data->m_sessions.erase(itr);
			continue;
		}
		// else // EWOULDBLOCK: session not deleted

		++itr;
	}

	// Process incoming clients
	std::unique_ptr<Jupiter::Socket> socket;
	for (auto& port : m_data->m_ports) {
		socket.reset(port->accept());
		if (socket != nullptr) {
			socket->setBlocking(false);
			auto session = std::make_unique<HTTPSession>(std::move(*socket));
			if (session->sock.recv() > 0) { // data received
				std::string_view sock_buffer = session->sock.getBuffer();
				if (sock_buffer.size() < m_data->max_request_size) { // accept
					session->request = session->sock.getBuffer();
					if (sock_buffer.find(HTTP_REQUEST_ENDING) != std::string_view::npos) { // completed request
						m_data->process_request(*session);
						if (session->keep_alive) { // session will live for 30 seconds.
							m_data->m_sessions.push_back(std::move(session));
						}
						// else // session completed
					}
					else { // store for more processing
						m_data->m_sessions.push_back(std::move(session));
					}
				}
				else if (sock_buffer.size() == m_data->max_request_size) {
					if (sock_buffer.find(HTTP_REQUEST_ENDING) == std::string_view::npos) { // reject (too large)
						continue;
					}

					// accept (max size, completed request)
					session->request = session->sock.getBuffer();
					m_data->process_request(*session);
					if (session->keep_alive) { // session will live for 30 seconds.
						m_data->m_sessions.push_back(std::move(session));
					}
					// else // session completed
				}
				// else // reject (too large)
			}
			else if (session->sock.getLastError() == JUPITER_SOCK_EWOULDBLOCK) { // store for more processing
				m_data->m_sessions.push_back(std::move(session));
			}
		}
	}
	return 0;
}